

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void test_fibonacci(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  shared_ptr<vmips::VirtReg> local_148;
  undefined1 local_138 [8];
  shared_ptr<vmips::VirtReg> sum;
  undefined1 local_118 [8];
  shared_ptr<vmips::VirtReg> res1;
  undefined1 local_f8 [8];
  shared_ptr<vmips::VirtReg> res0;
  shared_ptr<vmips::VirtReg> local_e0;
  undefined1 local_d0 [8];
  shared_ptr<vmips::VirtReg> n;
  shared_ptr<vmips::VirtReg> local_b8;
  undefined1 local_a8 [8];
  shared_ptr<vmips::VirtReg> m;
  undefined1 local_88 [8];
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> br;
  undefined1 local_60 [8];
  shared_ptr<vmips::VirtReg> one;
  undefined1 local_30 [8];
  shared_ptr<vmips::VirtReg> zero;
  undefined1 local_18 [8];
  shared_ptr<vmips::Function> f;
  
  zero.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
  std::make_shared<vmips::Function,char_const(&)[10],int>
            ((char (*) [10])local_18,(int *)"fibonacci");
  vmips::get_special((SpecialReg)local_30);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::entry();
  std::shared_ptr<vmips::CFGNode>::~shared_ptr
            ((shared_ptr<vmips::CFGNode> *)
             &one.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  br.second.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       1;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)local_60,(shared_ptr<vmips::VirtReg> *)peVar2,(int *)local_30);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::get_special((int)&m + k0);
  vmips::Function::
  branch<vmips::ble,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>&>
            ((pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> *)local_88,
             peVar2,(shared_ptr<vmips::VirtReg> *)
                    &m.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<vmips::VirtReg> *)local_60);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr
            ((shared_ptr<vmips::VirtReg> *)
             &m.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::get_special((SpecialReg)&local_b8);
  n.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0xffffffff;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>,int>
            ((Function *)local_a8,(shared_ptr<vmips::VirtReg> *)peVar2,(int *)&local_b8);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_b8);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::get_special((SpecialReg)&local_e0);
  res0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0xfffffffe;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>,int>
            ((Function *)local_d0,(shared_ptr<vmips::VirtReg> *)peVar2,(int *)&local_e0);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_e0);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  p_Var1 = &res1.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::weak_ptr<vmips::Function>::weak_ptr<vmips::Function,void>
            ((weak_ptr<vmips::Function> *)p_Var1,(shared_ptr<vmips::Function> *)local_18);
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            ((Function *)local_f8,(weak_ptr<vmips::Function> *)peVar2,
             (shared_ptr<vmips::VirtReg> *)p_Var1);
  std::weak_ptr<vmips::Function>::~weak_ptr
            ((weak_ptr<vmips::Function> *)
             &res1.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  p_Var1 = &sum.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::weak_ptr<vmips::Function>::weak_ptr<vmips::Function,void>
            ((weak_ptr<vmips::Function> *)p_Var1,(shared_ptr<vmips::Function> *)local_18);
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            ((Function *)local_118,(weak_ptr<vmips::Function> *)peVar2,
             (shared_ptr<vmips::VirtReg> *)p_Var1);
  std::weak_ptr<vmips::Function>::~weak_ptr
            ((weak_ptr<vmips::Function> *)
             &sum.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)local_138,(shared_ptr<vmips::VirtReg> *)peVar2,
             (shared_ptr<vmips::VirtReg> *)local_f8);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&local_148,(shared_ptr<vmips::VirtReg> *)local_138);
  vmips::Function::assign_special(peVar2,2,&local_148);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_148);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::add_ret();
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::switch_to(peVar2);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::assign_special((SpecialReg)peVar2,2);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::output((ostream *)peVar2);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::color();
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::output((ostream *)peVar2);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::scan_overlap();
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::output((ostream *)peVar2);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::handle_alloca();
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  peVar2 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::output((ostream *)peVar2);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_138);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_118);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_f8);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_d0);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_a8);
  std::pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>::~pair
            ((pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> *)local_88);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_60);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_30);
  std::shared_ptr<vmips::Function>::~shared_ptr((shared_ptr<vmips::Function> *)local_18);
  return;
}

Assistant:

void test_fibonacci() {
    auto f  = std::make_shared<Function>("fibonacci", 1);
    auto zero = get_special(SpecialReg::zero);
    f->entry();
    auto one = f->append<addi>(zero, 1);
    auto br = f->branch<ble>(get_special(SpecialReg::a0), one);

    // arg > 1
    auto m = f->append<addi>(get_special(SpecialReg::a0), -1);
    auto n = f->append<addi>(get_special(SpecialReg::a0), -2);
    auto res0 = f->call(f, m);
    auto res1 = f->call(f, n);
    auto sum = f->append<add>(res0, res1);
    f->assign_special(SpecialReg::v0, sum);
    f->add_ret();

    // arg <= 1
    f->switch_to(br.second);
    f->assign_special(SpecialReg::v0, 1);

    f->output(std::cout);

    f->color();
    std::cout << std::endl;
    f->output(std::cout);

    f->scan_overlap();
    std::cout << std::endl;
    f->output(std::cout);

    f->handle_alloca();
    std::cout << std::endl;
    f->output(std::cout);

}